

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O2

void __thiscall LFPConsumer::~LFPConsumer(LFPConsumer *this)

{
  ~LFPConsumer(this);
  operator_delete(this,0x420);
  return;
}

Assistant:

LFPConsumer::~LFPConsumer(){

}